

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

int32 cmd_ln_parse(arg_t *defn,int32 argc,char **argv,int strict)

{
  cmd_ln_t *pcVar1;
  cmd_ln_t *cmdln;
  int strict_local;
  char **argv_local;
  int32 argc_local;
  arg_t *defn_local;
  
  pcVar1 = cmd_ln_parse_r(global_cmdln,defn,argc,argv,strict);
  if (pcVar1 == (cmd_ln_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x2f0,"Failed to parse arguments list, forced exit\n");
    exit(-1);
  }
  if (global_cmdln == (cmd_ln_t *)0x0) {
    global_cmdln = pcVar1;
  }
  return 0;
}

Assistant:

int
cmd_ln_parse(const arg_t * defn, int32 argc, char *argv[], int strict)
{
    cmd_ln_t *cmdln;

    cmdln = cmd_ln_parse_r(global_cmdln, defn, argc, argv, strict);
    if (cmdln == NULL) {
        /* Old, bogus behaviour... */
        E_ERROR("Failed to parse arguments list, forced exit\n");
        exit(-1);
    }
    /* Initialize global_cmdln if not present. */
    if (global_cmdln == NULL) {
        global_cmdln = cmdln;
    }
    return 0;
}